

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psa_crypto.c
# Opt level: O0

psa_status_t
psa_sign_hash(psa_key_handle_t handle,psa_algorithm_t alg,uint8_t *hash,size_t hash_length,
             uint8_t *signature,size_t signature_size,size_t *signature_length)

{
  psa_algorithm_t local_44;
  psa_key_slot_t *ppStack_40;
  psa_status_t status;
  psa_key_slot_t *slot;
  size_t signature_size_local;
  uint8_t *signature_local;
  size_t hash_length_local;
  uint8_t *hash_local;
  psa_key_handle_t local_e;
  psa_algorithm_t alg_local;
  psa_key_handle_t handle_local;
  
  *signature_length = signature_size;
  if (signature_size == 0) {
    alg_local = 0xffffff76;
  }
  else {
    slot = (psa_key_slot_t *)signature_size;
    signature_size_local = (size_t)signature;
    signature_local = (uint8_t *)hash_length;
    hash_length_local = (size_t)hash;
    hash_local._4_4_ = alg;
    local_e = handle;
    local_44 = psa_get_key_from_slot(handle,&stack0xffffffffffffffc0,0x400,alg);
    if (local_44 == 0) {
      if (((ppStack_40->attr).type & 0x7000) == 0x7000) {
        if ((ppStack_40->attr).type == 0x7001) {
          local_44 = psa_rsa_sign((ppStack_40->data).rsa,hash_local._4_4_,
                                  (uint8_t *)hash_length_local,(size_t)signature_local,
                                  (uint8_t *)signature_size_local,(size_t)slot,signature_length);
        }
        else if (((ppStack_40->attr).type & 0xcf00) == 0x4100) {
          if ((hash_local._4_4_ & 0xfffeff00) == 0x10060000) {
            local_44 = psa_ecdsa_sign((ppStack_40->data).ecp,hash_local._4_4_,
                                      (uint8_t *)hash_length_local,(size_t)signature_local,
                                      (uint8_t *)signature_size_local,(size_t)slot,signature_length)
            ;
          }
          else {
            local_44 = 0xffffff79;
          }
        }
        else {
          local_44 = 0xffffff7a;
        }
      }
      else {
        local_44 = 0xffffff79;
      }
    }
    if (local_44 == 0) {
      memset((void *)(signature_size_local + *signature_length),0x21,(long)slot - *signature_length)
      ;
    }
    else {
      memset((void *)signature_size_local,0x21,(size_t)slot);
    }
    alg_local = local_44;
  }
  return alg_local;
}

Assistant:

psa_status_t psa_sign_hash( psa_key_handle_t handle,
                            psa_algorithm_t alg,
                            const uint8_t *hash,
                            size_t hash_length,
                            uint8_t *signature,
                            size_t signature_size,
                            size_t *signature_length )
{
    psa_key_slot_t *slot;
    psa_status_t status;
#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    const psa_drv_se_t *drv;
    psa_drv_se_context_t *drv_context;
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */

    *signature_length = signature_size;
    /* Immediately reject a zero-length signature buffer. This guarantees
     * that signature must be a valid pointer. (On the other hand, the hash
     * buffer can in principle be empty since it doesn't actually have
     * to be a hash.) */
    if( signature_size == 0 )
        return( PSA_ERROR_BUFFER_TOO_SMALL );

    status = psa_get_key_from_slot( handle, &slot, PSA_KEY_USAGE_SIGN_HASH, alg );
    if( status != PSA_SUCCESS )
        goto exit;
    if( ! PSA_KEY_TYPE_IS_KEY_PAIR( slot->attr.type ) )
    {
        status = PSA_ERROR_INVALID_ARGUMENT;
        goto exit;
    }

#if defined(MBEDTLS_PSA_CRYPTO_SE_C)
    if( psa_get_se_driver( slot->attr.lifetime, &drv, &drv_context ) )
    {
        if( drv->asymmetric == NULL ||
            drv->asymmetric->p_sign == NULL )
        {
            status = PSA_ERROR_NOT_SUPPORTED;
            goto exit;
        }
        status = drv->asymmetric->p_sign( drv_context,
                                          slot->data.se.slot_number,
                                          alg,
                                          hash, hash_length,
                                          signature, signature_size,
                                          signature_length );
    }
    else
#endif /* MBEDTLS_PSA_CRYPTO_SE_C */
#if defined(MBEDTLS_RSA_C)
    if( slot->attr.type == PSA_KEY_TYPE_RSA_KEY_PAIR )
    {
        status = psa_rsa_sign( slot->data.rsa,
                               alg,
                               hash, hash_length,
                               signature, signature_size,
                               signature_length );
    }
    else
#endif /* defined(MBEDTLS_RSA_C) */
#if defined(MBEDTLS_ECP_C)
    if( PSA_KEY_TYPE_IS_ECC( slot->attr.type ) )
    {
#if defined(MBEDTLS_ECDSA_C)
        if(
#if defined(MBEDTLS_ECDSA_DETERMINISTIC)
            PSA_ALG_IS_ECDSA( alg )
#else
            PSA_ALG_IS_RANDOMIZED_ECDSA( alg )
#endif
            )
            status = psa_ecdsa_sign( slot->data.ecp,
                                     alg,
                                     hash, hash_length,
                                     signature, signature_size,
                                     signature_length );
        else
#endif /* defined(MBEDTLS_ECDSA_C) */
        {
            status = PSA_ERROR_INVALID_ARGUMENT;
        }
    }
    else
#endif /* defined(MBEDTLS_ECP_C) */
    {
        status = PSA_ERROR_NOT_SUPPORTED;
    }

exit:
    /* Fill the unused part of the output buffer (the whole buffer on error,
     * the trailing part on success) with something that isn't a valid mac
     * (barring an attack on the mac and deliberately-crafted input),
     * in case the caller doesn't check the return status properly. */
    if( status == PSA_SUCCESS )
        memset( signature + *signature_length, '!',
                signature_size - *signature_length );
    else
        memset( signature, '!', signature_size );
    /* If signature_size is 0 then we have nothing to do. We must not call
     * memset because signature may be NULL in this case. */
    return( status );
}